

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64qd_(int_t *ip,int_t *lenl,int_t *lenh,int_t *w,int_t *wlen,double *a,int_t *nval,
             double *val)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  double adStack_90 [7];
  double split [10];
  
  *nval = 0;
  iVar10 = *wlen;
  uVar9 = 0;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  uVar8 = 1;
  do {
    if (uVar8 == iVar10 + 1) {
      if (0 < (int)uVar9) {
LAB_00112f65:
        *val = adStack_90[(ulong)((uVar9 + 1 >> 1) - 1) + 1];
      }
      return 0;
    }
    lVar5 = (long)w[uVar8 - 1];
    iVar3 = ip[lVar5 + -1];
    iVar4 = lenh[lVar5 + -1];
    for (lVar5 = (long)(lenl[lVar5 + -1] + iVar3); lVar5 < (long)iVar4 + (long)iVar3;
        lVar5 = lVar5 + 1) {
      dVar1 = a[lVar5 + -1];
      if (uVar9 == 0) {
        adStack_90[1] = dVar1;
        *nval = 1;
        uVar9 = 1;
      }
      else {
        uVar6 = (ulong)uVar9;
        iVar11 = uVar9 + 2;
        do {
          if ((int)uVar6 < 1) {
            iVar11 = 1;
            break;
          }
          dVar2 = adStack_90[uVar6];
          if ((dVar2 == dVar1) && (!NAN(dVar2) && !NAN(dVar1))) goto LAB_00112f4d;
          iVar11 = iVar11 + -1;
          uVar6 = uVar6 - 1;
        } while (dVar2 <= dVar1);
        uVar6 = (ulong)uVar9;
        while (iVar11 <= (int)uVar6) {
          uVar7 = (ulong)((int)uVar6 - 1);
          adStack_90[uVar6 + 1] = adStack_90[uVar7 + 1];
          uVar6 = uVar7;
        }
        adStack_90[(ulong)(iVar11 - 1) + 1] = dVar1;
        uVar9 = uVar9 + 1;
        *nval = uVar9;
        if (uVar9 == 10) {
          uVar9 = 10;
          goto LAB_00112f65;
        }
      }
LAB_00112f4d:
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int_t mc64qd_(int_t *ip, int_t *lenl, int_t *lenh, 
	int_t *w, int_t *wlen, double *a, int_t *nval, double *
	val)
{
    /* System generated locals */
    int_t i__1, i__2, i__3;

    /* Local variables */
    int_t j, k, s;
    double ha;
    int_t ii, pos;
    double split[10];


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* This routine searches for at most XX different numerical values */
/* in the columns W(1:WLEN). XX>=2. */
/* Each column J is scanned between IP(J)+LENL(J) and IP(J)+LENH(J)-1 */
/* until XX values are found or all columns have been considered. */
/* On output, NVAL is the number of different values that is found */
/* and SPLIT(1:NVAL) contains the values in decreasing order. */
/* If NVAL > 0, the routine returns VAL = SPLIT((NVAL+1)/2). */

/* Scan columns in W(1:WLEN). For each encountered value, if value not */
/* already present in SPLIT(1:NVAL), insert value such that SPLIT */
/* remains sorted by decreasing value. */
/* The sorting is done by straightforward insertion; therefore the use */
/* of this routine should be avoided for large XX (XX < 20). */
    /* Parameter adjustments */
    --a;
    --w;
    --lenh;
    --lenl;
    --ip;

    /* Function Body */
    *nval = 0;
    i__1 = *wlen;
    for (k = 1; k <= i__1; ++k) {
	j = w[k];
	i__2 = ip[j] + lenh[j] - 1;
	for (ii = ip[j] + lenl[j]; ii <= i__2; ++ii) {
	    ha = a[ii];
	    if (*nval == 0) {
		split[0] = ha;
		*nval = 1;
	    } else {
/* Check presence of HA in SPLIT */
		for (s = *nval; s >= 1; --s) {
		    if (split[s - 1] == ha) {
			goto L15;
		    }
		    if (split[s - 1] > ha) {
			pos = s + 1;
			goto L21;
		    }
/* L20: */
		}
		pos = 1;
/* The insertion */
L21:
		i__3 = pos;
		for (s = *nval; s >= i__3; --s) {
		    split[s] = split[s - 1];
/* L22: */
		}
		split[pos - 1] = ha;
		++(*nval);
	    }
/* Exit loop if XX values are found */
	    if (*nval == 10) {
		goto L11;
	    }
L15:
	    ;
	}
/* L10: */
    }
/* Determine VAL */
L11:
    if (*nval > 0) {
	*val = split[(*nval + 1) / 2 - 1];
    }
    return 0;
}